

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

ostream * std::operator<<(ostream *ofs,Payload *v)

{
  bool bVar1;
  Payload *v_local;
  ostream *ofs_local;
  
  bVar1 = tinyusdz::Payload::is_none(v);
  if (bVar1) {
    std::operator<<(ofs,"None");
  }
  else {
    operator<<(ofs,&v->asset_path);
    bVar1 = tinyusdz::Path::is_valid(&v->prim_path);
    if (bVar1) {
      operator<<(ofs,&v->prim_path);
    }
    operator<<(ofs,&v->layerOffset);
  }
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Payload &v) {
  if (v.is_none()) {
    ofs << "None";
  } else {
    ofs << v.asset_path;
    if (v.prim_path.is_valid()) {
      ofs << v.prim_path;
    }
    ofs << v.layerOffset;
  }

  return ofs;
}